

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseSerializers.h
# Opt level: O1

bool __thiscall
tonk::protocol::P2PConnectParams::Write(P2PConnectParams *this,WriteByteStream *stream)

{
  undefined2 uVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  uint8_t uVar6;
  uint uVar7;
  uint8_t uVar8;
  
  uVar4 = stream->BufferBytes - stream->WrittenBytes;
  if (0x20 < uVar4) {
    uVar8 = (uint8_t)*(undefined4 *)this + '\x02';
    if ((this->PeerExternalAddress).impl_.data_.base.sa_family == 2) {
      uVar8 = (uint8_t)*(undefined4 *)this;
    }
    uVar6 = uVar8 + '\x04';
    if (this->PeerNATMappedPort == 0) {
      uVar6 = uVar8;
    }
    stream->Data[stream->WrittenBytes] = uVar6;
    uVar7 = stream->WrittenBytes;
    stream->WrittenBytes = uVar7 + 1;
    puVar2 = stream->Data;
    *(uint64_t *)(puVar2 + (uVar7 + 1)) = this->EncryptionKey;
    stream->WrittenBytes = uVar7 + 9;
    *(uint16_t *)(puVar2 + (uVar7 + 9)) = this->ProtocolRoundIntervalMsec;
    stream->WrittenBytes = uVar7 + 0xb;
    *(uint16_t *)(puVar2 + (uVar7 + 0xb)) = this->ShotTS16;
    stream->WrittenBytes = uVar7 + 0xd;
    *(uint16_t *)(puVar2 + (uVar7 + 0xd)) = this->SelfExternalPort;
    stream->WrittenBytes = uVar7 + 0xf;
    if (this->PeerNATMappedPort != 0) {
      *(uint16_t *)(puVar2 + (uVar7 + 0xf)) = this->PeerNATMappedPort;
      stream->WrittenBytes = uVar7 + 0x11;
    }
    uVar7 = stream->WrittenBytes;
    uVar1 = swap_bytes((this->PeerExternalAddress).impl_.data_.v4.sin_port);
    *(undefined2 *)(puVar2 + uVar7) = uVar1;
    uVar7 = uVar7 + 2;
    stream->WrittenBytes = uVar7;
    if ((this->PeerExternalAddress).impl_.data_.base.sa_family == 2) {
      *(in_addr_t *)(puVar2 + uVar7) = (this->PeerExternalAddress).impl_.data_.v4.sin_addr.s_addr;
      iVar5 = 4;
    }
    else {
      uVar3 = *(undefined8 *)((long)&(this->PeerExternalAddress).impl_.data_ + 0x10);
      *(undefined8 *)(puVar2 + uVar7) =
           *(undefined8 *)((long)&(this->PeerExternalAddress).impl_.data_ + 8);
      *(undefined8 *)(puVar2 + uVar7 + 8) = uVar3;
      iVar5 = 0x10;
    }
    stream->WrittenBytes = stream->WrittenBytes + iVar5;
  }
  return 0x20 < uVar4;
}

Assistant:

SIAMESE_FORCE_INLINE unsigned Remaining()
    {
        SIAMESE_DEBUG_ASSERT(WrittenBytes <= BufferBytes);
        return BufferBytes - WrittenBytes;
    }